

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree(KDTree<phosg::Vector2<long>,_long> *this)

{
  value_type pNVar1;
  bool bVar2;
  reference ppNVar3;
  Node *n;
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  to_delete;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  to_delete.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
           *)&n);
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
  ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
            ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
              *)&n,&this->root);
  while (bVar2 = ::std::
                 deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 ::empty((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                          *)&n), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppNVar3 = ::std::
              deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ::front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                       *)&n);
    pNVar1 = *ppNVar3;
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::pop_front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 *)&n);
    if (pNVar1->before != (Node *)0x0) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)&n,&pNVar1->before);
    }
    if (pNVar1->after_or_equal != (Node *)0x0) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)&n,&pNVar1->after_or_equal);
    }
    if (pNVar1 != (value_type)0x0) {
      operator_delete(pNVar1,0x38);
    }
  }
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            *)&n);
  return;
}

Assistant:

KDTree<CoordType, ValueType>::~KDTree() {
  std::deque<Node*> to_delete;
  to_delete.emplace_back(this->root);
  while (!to_delete.empty()) {
    Node* n = to_delete.front();
    to_delete.pop_front();

    if (n->before) {
      to_delete.emplace_back(n->before);
    }
    if (n->after_or_equal) {
      to_delete.emplace_back(n->after_or_equal);
    }
    delete n;
  }
}